

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseNewExpression
          (Parser *this,NameSyntax *newKeyword,
          bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  NameSyntax *pNVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  ExpressionSyntax *pEVar4;
  ExpressionSyntax *expression;
  ParenthesizedExpressionSyntax *initializer;
  NewArrayExpressionSyntax *pNVar5;
  ScopedNameSyntax *pSVar6;
  SourceLocation SVar7;
  Diagnostic *pDVar8;
  ArgumentListSyntax *argList;
  CopyClassExpressionSyntax *pCVar9;
  TokenKind kind;
  Token TVar10;
  Token closeBracket;
  Token openParen;
  Token closeParen;
  SourceRange SVar11;
  Token local_40;
  
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  kind = TVar10.kind;
  if (kind == OpenBracket) {
    TVar10 = ParserBase::consume(&this->super_ParserBase);
    initializer = (ParenthesizedExpressionSyntax *)0x0;
    pEVar4 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
    closeBracket = ParserBase::expect(&this->super_ParserBase,CloseBracket);
    bVar3 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar3) {
      openParen = ParserBase::consume(&this->super_ParserBase);
      expression = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0
                                     );
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      initializer = slang::syntax::SyntaxFactory::parenthesizedExpression
                              (&this->factory,openParen,expression,closeParen);
    }
    pNVar5 = slang::syntax::SyntaxFactory::newArrayExpression
                       (&this->factory,newKeyword,TVar10,pEVar4,closeBracket,initializer);
  }
  else {
    if ((newKeyword->super_ExpressionSyntax).super_SyntaxNode.kind == ScopedName) {
      pSVar6 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>
                         ((SyntaxNode *)newKeyword);
      pNVar1 = (pSVar6->right).ptr;
      if (pNVar1 == (NameSyntax *)0x0) {
LAB_0031d7df:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]"
                  );
      }
      if ((pNVar1->super_ExpressionSyntax).super_SyntaxNode.kind == ConstructorName) {
        pSVar2 = (SyntaxNode *)(pSVar6->left).ptr;
        if (pSVar2 == (SyntaxNode *)0x0) goto LAB_0031d7df;
        TVar10 = slang::syntax::SyntaxNode::getLastToken(pSVar2);
        if ((options.m_bits & 8) == 0 && TVar10.kind == SuperKeyword) {
          pSVar2 = (SyntaxNode *)(pSVar6->right).ptr;
          if (pSVar2 == (SyntaxNode *)0x0) goto LAB_0031d7df;
          local_40 = slang::syntax::SyntaxNode::getFirstToken(pSVar2);
          SVar7 = Token::location(&local_40);
          pDVar8 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x640005,SVar7);
          SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)newKeyword);
          Diagnostic::operator<<(pDVar8,SVar11);
        }
      }
    }
    if (kind == OpenParenthesis) {
      argList = parseArgumentList(this);
    }
    else {
      bVar3 = slang::syntax::SyntaxFacts::isPossibleExpression(kind);
      if (bVar3) {
        if ((newKeyword->super_ExpressionSyntax).super_SyntaxNode.kind != ConstructorName) {
          local_40 = ParserBase::peek(&this->super_ParserBase);
          SVar7 = Token::location(&local_40);
          pDVar8 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x840005,SVar7);
          SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)newKeyword);
          Diagnostic::operator<<(pDVar8,SVar11);
        }
        pEVar4 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
        pCVar9 = slang::syntax::SyntaxFactory::copyClassExpression(&this->factory,newKeyword,pEVar4)
        ;
        return &pCVar9->super_ExpressionSyntax;
      }
      argList = (ArgumentListSyntax *)0x0;
    }
    pNVar5 = (NewArrayExpressionSyntax *)
             slang::syntax::SyntaxFactory::newClassExpression(&this->factory,newKeyword,argList);
  }
  return &pNVar5->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseNewExpression(NameSyntax& newKeyword,
                                             bitmask<ExpressionOptions> options) {
    // If we see an open bracket, this is a dynamic array new expression.
    auto kind = peek().kind;
    if (kind == TokenKind::OpenBracket) {
        auto openBracket = consume();
        auto& sizeExpr = parseExpression();
        auto closeBracket = expect(TokenKind::CloseBracket);

        ParenthesizedExpressionSyntax* initializer = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& initializerExpr = parseExpression();
            initializer = &factory.parenthesizedExpression(openParen, initializerExpr,
                                                           expect(TokenKind::CloseParenthesis));
        }
        return factory.newArrayExpression(newKeyword, openBracket, sizeExpr, closeBracket,
                                          initializer);
    }

    // Enforce rules for super.new placement.
    if (newKeyword.kind == SyntaxKind::ScopedName) {
        auto& scoped = newKeyword.as<ScopedNameSyntax>();
        if (scoped.right->kind == SyntaxKind::ConstructorName &&
            scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            if ((options & ExpressionOptions::AllowSuperNewCall) == 0) {
                addDiag(diag::InvalidSuperNew, scoped.right->getFirstToken().location())
                    << newKeyword.sourceRange();
            }
        }
    }

    // Otherwise this is a new-class or copy-class expression.
    // new-class has an optional argument list, copy-class has a required expression.
    // An open paren here would be ambiguous between an arg list and a parenthesized
    // expression -- we resolve by always taking the arg list.
    if (kind == TokenKind::OpenParenthesis)
        return factory.newClassExpression(newKeyword, &parseArgumentList());

    if (isPossibleExpression(kind)) {
        if (newKeyword.kind != SyntaxKind::ConstructorName)
            addDiag(diag::ScopedClassCopy, peek().location()) << newKeyword.sourceRange();
        return factory.copyClassExpression(newKeyword, parseExpression());
    }

    return factory.newClassExpression(newKeyword, nullptr);
}